

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall cs::domain_manager::next_domain(domain_manager *this)

{
  domain_type *pdVar1;
  stack_pointer this_00;
  
  this_00 = &this->m_data;
  if (*this->fiber_stack != (stack_pointer)0x0) {
    this_00 = *this->fiber_stack;
  }
  pdVar1 = stack_type<cs::domain_type,_std::allocator>::top(this_00);
  pdVar1->optimize = true;
  return;
}

Assistant:

void next_domain()
		{
			if (fiber_stack != nullptr)
				fiber_stack->top().next();
			else
				m_data.top().next();
		}